

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void timer_update(gb_timer_t *timer,int elapsed_cycles)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (timer == (gb_timer_t *)0x0) {
    __assert_fail("timer != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/timer.c"
                  ,0x61,"void timer_update(gb_timer_t *, int)");
  }
  uVar1 = timer->div_cycles + elapsed_cycles;
  uVar2 = timer->div_cycles + elapsed_cycles + 0xff;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  timer->div_cycles = uVar1 - (uVar2 & 0xffffff00);
  timer->reg_div = timer->reg_div + (char)(uVar2 >> 8);
  if ((timer->reg_tac & 4) != 0) {
    iVar4 = elapsed_cycles + timer->timer_cycles;
    iVar3 = timer_periods[timer->reg_tac & 3];
    timer->timer_cycles = iVar4 % iVar3;
    iVar3 = (uint)timer->reg_tima + iVar4 / iVar3;
    if (0xff < iVar3) {
      timer->reg_tima = timer->reg_tma;
      int_request(&timer->gb->intr_ctrl,INT_TIMA);
      return;
    }
    timer->reg_tima = (uint8_t)iVar3;
  }
  return;
}

Assistant:

void timer_update(gb_timer_t *timer, int elapsed_cycles)
{
    assert(timer != NULL);

    timer->div_cycles += elapsed_cycles;
    int div_ticks = timer->div_cycles / DIV_TICK_PERIOD;
    timer->div_cycles %= DIV_TICK_PERIOD;

    timer->reg_div += div_ticks;

    if (timer->reg_tac & 0x04)
    {
        // Timer is enabled

        int timer_period = timer_periods[timer->reg_tac & 0x3];

        timer->timer_cycles += elapsed_cycles;
        int timer_ticks = timer->timer_cycles / timer_period;
        timer->timer_cycles %= timer_period;

        if (timer->reg_tima + timer_ticks > 255)
        {
            timer->reg_tima = timer->reg_tma;
            int_request(&timer->gb->intr_ctrl, INT_TIMA);
        }
        else
            timer->reg_tima += timer_ticks;
    }
}